

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnInitExprRefNull(BinaryReaderIR *this,Index index)

{
  intrusive_list<wabt::Expr> *this_00;
  unique_ptr<wabt::ExprMixin<(wabt::ExprType)35>,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)35>_>_>
  local_50;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_48;
  undefined1 local_40 [8];
  Location loc;
  Index index_local;
  BinaryReaderIR *this_local;
  
  loc.field_1._12_4_ = index;
  GetLocation((Location *)local_40,this);
  this_00 = this->current_init_expr_;
  MakeUnique<wabt::ExprMixin<(wabt::ExprType)35>,wabt::Location&>
            ((wabt *)&local_50,(Location *)local_40);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::ExprMixin<(wabt::ExprType)35>,std::default_delete<wabt::ExprMixin<(wabt::ExprType)35>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_48,&local_50);
  intrusive_list<wabt::Expr>::push_back(this_00,&local_48);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_48);
  std::
  unique_ptr<wabt::ExprMixin<(wabt::ExprType)35>,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)35>_>_>
  ::~unique_ptr(&local_50);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnInitExprRefNull(Index index) {
  Location loc = GetLocation();
  current_init_expr_->push_back(MakeUnique<RefNullExpr>(loc));
  return Result::Ok;
}